

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_32x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  uint uVar21;
  uint8_t *puVar22;
  short sVar23;
  short sVar24;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar25 [16];
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar56 [16];
  short sVar57;
  ushort uVar58;
  ushort uVar59;
  short sVar61;
  ushort uVar62;
  ushort uVar63;
  short sVar64;
  ushort uVar65;
  ushort uVar66;
  short sVar67;
  ushort uVar68;
  ushort uVar69;
  short sVar70;
  ushort uVar71;
  ushort uVar72;
  short sVar73;
  ushort uVar74;
  ushort uVar75;
  short sVar76;
  ushort uVar77;
  ushort uVar78;
  short sVar79;
  ushort uVar80;
  ushort uVar81;
  undefined1 auVar60 [16];
  undefined1 auVar82 [16];
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  
  auVar25 = pshuflw(ZEXT116(top_row[0x1f]),ZEXT116(top_row[0x1f]),0);
  uVar1 = *(ulong *)left_column;
  sVar23 = auVar25._0_2_;
  sVar32 = auVar25._2_2_;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[10] = (char)(uVar1 >> 0x28);
  auVar7._11_4_ = auVar5._11_4_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = (char)(uVar1 >> 0x20);
  auVar11._0_8_ = uVar1;
  auVar11._9_6_ = auVar9._9_6_;
  auVar15._7_8_ = 0;
  auVar15._0_7_ = auVar11._8_7_;
  auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
  auVar17[0] = (char)(uVar1 >> 0x18);
  auVar17._9_6_ = 0;
  auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
  auVar18[0] = (char)(uVar1 >> 0x10);
  auVar18._11_4_ = 0;
  auVar14[2] = (char)(uVar1 >> 8);
  auVar14._0_2_ = (ushort)uVar1;
  auVar14._3_12_ = SUB1512(auVar18 << 0x20,3);
  auVar25._0_2_ = (ushort)uVar1 & 0xff;
  auVar25._2_13_ = auVar14._2_13_;
  auVar25[0xf] = 0;
  sVar33 = sVar32 * 0x10 + 0x80;
  sVar34 = sVar23 * 0x1f + 0x80;
  sVar35 = sVar32 * 0x2e + 0x80;
  sVar36 = sVar23 * 0x3c + 0x80;
  sVar37 = sVar32 * 0x4a + 0x80;
  sVar38 = sVar23 * 0x57 + 0x80;
  sVar39 = sVar32 * 99 + 0x80;
  sVar40 = sVar23 * 0x6f + 0x80;
  sVar41 = sVar32 * 0x7b + 0x80;
  sVar42 = sVar23 * 0x86 + 0x80;
  sVar43 = sVar32 * 0x91 + 0x80;
  sVar44 = sVar23 * 0x9b + 0x80;
  sVar45 = sVar32 * 0xa4 + 0x80;
  sVar46 = sVar23 * 0xad + 0x80;
  sVar47 = sVar32 * 0xb6 + 0x80;
  sVar48 = sVar23 * 0xbe + 0x80;
  sVar49 = sVar32 * 0xc5 + 0x80;
  sVar50 = sVar23 * 0xcc + 0x80;
  sVar51 = sVar32 * 0xd3 + 0x80;
  sVar52 = sVar23 * 0xd9 + 0x80;
  sVar53 = sVar32 * 0xde + 0x80;
  sVar54 = sVar23 * 0xe3 + 0x80;
  sVar55 = sVar32 * 0xe7 + 0x80;
  sVar24 = sVar23 * 0xeb + 0x80;
  sVar26 = sVar32 * 0xef + 0x80;
  sVar27 = sVar23 * 0xf2 + 0x80;
  sVar28 = sVar32 * 0xf4 + 0x80;
  sVar29 = sVar23 * 0xf6 + 0x80;
  sVar30 = sVar32 * 0xf7 + 0x80;
  sVar31 = sVar23 * 0xf8 + 0x80;
  sVar32 = sVar32 * 0xf8 + 0x80;
  puVar22 = dst + 0x10;
  uVar21 = 0xfefdfefe;
  do {
    uVar21 = uVar21 + 0x2020202;
    auVar82._4_4_ = uVar21;
    auVar82._0_4_ = uVar21;
    auVar82._8_4_ = uVar21;
    auVar82._12_4_ = uVar21;
    auVar82 = pshufb(auVar25,auVar82);
    sVar57 = auVar82._0_2_;
    sVar61 = auVar82._2_2_;
    sVar64 = auVar82._4_2_;
    sVar67 = auVar82._6_2_;
    sVar70 = auVar82._8_2_;
    sVar73 = auVar82._10_2_;
    sVar76 = auVar82._12_2_;
    sVar79 = auVar82._14_2_;
    uVar58 = sVar57 * 0xff + sVar23 + 0x80;
    uVar62 = sVar61 * 0xf0 + sVar33;
    uVar65 = sVar64 * 0xe1 + sVar34;
    uVar68 = sVar67 * 0xd2 + sVar35;
    uVar71 = sVar70 * 0xc4 + sVar36;
    uVar74 = sVar73 * 0xb6 + sVar37;
    uVar77 = sVar76 * 0xa9 + sVar38;
    uVar80 = sVar79 * 0x9d + sVar39;
    uVar59 = uVar58 >> 8;
    uVar63 = uVar62 >> 8;
    uVar66 = uVar65 >> 8;
    uVar69 = uVar68 >> 8;
    uVar72 = uVar71 >> 8;
    uVar75 = uVar74 >> 8;
    uVar78 = uVar77 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = sVar57 * 0x91 + sVar40;
    uVar85 = sVar61 * 0x85 + sVar41;
    uVar87 = sVar64 * 0x7a + sVar42;
    uVar89 = sVar67 * 0x6f + sVar43;
    uVar91 = sVar70 * 0x65 + sVar44;
    uVar93 = sVar73 * 0x5c + sVar45;
    uVar95 = sVar76 * 0x53 + sVar46;
    uVar97 = sVar79 * 0x4a + sVar47;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    puVar22[-0x10] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar22[-0xf] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
    puVar22[-0xe] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    puVar22[-0xd] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    puVar22[-0xc] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar22[-0xb] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar22[-10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar22[-9] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar22[-8] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar22[-7] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar22[-6] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar22[-5] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar22[-4] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-3] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-2] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-1] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    uVar58 = sVar57 * 0x42 + sVar48;
    uVar62 = sVar61 * 0x3b + sVar49;
    uVar65 = sVar64 * 0x34 + sVar50;
    uVar68 = sVar67 * 0x2d + sVar51;
    uVar71 = sVar70 * 0x27 + sVar52;
    uVar74 = sVar73 * 0x22 + sVar53;
    uVar77 = sVar76 * 0x1d + sVar54;
    uVar80 = sVar79 * 0x19 + sVar55;
    uVar59 = uVar58 >> 8;
    uVar63 = uVar62 >> 8;
    uVar66 = uVar65 >> 8;
    uVar69 = uVar68 >> 8;
    uVar72 = uVar71 >> 8;
    uVar75 = uVar74 >> 8;
    uVar78 = uVar77 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = sVar57 * 0x15 + sVar24;
    uVar85 = sVar61 * 0x11 + sVar26;
    uVar87 = sVar64 * 0xe + sVar27;
    uVar89 = sVar67 * 0xc + sVar28;
    uVar91 = sVar70 * 10 + sVar29;
    uVar93 = sVar73 * 9 + sVar30;
    uVar95 = sVar76 * 8 + sVar31;
    uVar97 = sVar79 * 8 + sVar32;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    *puVar22 = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar22[1] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
    puVar22[2] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    puVar22[3] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    puVar22[4] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar22[5] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar22[6] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar22[7] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar22[8] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar22[9] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar22[10] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar22[0xb] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar22[0xc] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[0xd] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[0xe] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[0xf] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22 = puVar22 + stride;
  } while (uVar21 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xc] = (char)(uVar1 >> 0x30);
  auVar6._13_2_ = auVar4._13_2_;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[10] = (char)(uVar1 >> 0x28);
  auVar10._11_4_ = auVar8._11_4_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._10_5_ = auVar10._10_5_;
  auVar13[8] = (char)(uVar1 >> 0x20);
  auVar13._0_8_ = uVar1;
  auVar13._9_6_ = auVar12._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar13._8_7_;
  auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
  auVar19[0] = (char)(uVar1 >> 0x18);
  auVar19._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar20[0] = (char)(uVar1 >> 0x10);
  auVar20._11_4_ = 0;
  auVar56._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar56[2] = (char)(uVar1 >> 8);
  auVar56[0] = (byte)uVar1;
  auVar56[1] = 0;
  auVar56[0xf] = 0;
  uVar21 = 0xfefdfefe;
  do {
    uVar21 = uVar21 + 0x2020202;
    auVar60._4_4_ = uVar21;
    auVar60._0_4_ = uVar21;
    auVar60._8_4_ = uVar21;
    auVar60._12_4_ = uVar21;
    auVar25 = pshufb(auVar56,auVar60);
    sVar57 = auVar25._0_2_;
    sVar61 = auVar25._2_2_;
    sVar64 = auVar25._4_2_;
    sVar67 = auVar25._6_2_;
    sVar70 = auVar25._8_2_;
    sVar73 = auVar25._10_2_;
    sVar76 = auVar25._12_2_;
    sVar79 = auVar25._14_2_;
    uVar58 = sVar57 * 0xff + sVar23 + 0x80;
    uVar62 = sVar61 * 0xf0 + sVar33;
    uVar65 = sVar64 * 0xe1 + sVar34;
    uVar68 = sVar67 * 0xd2 + sVar35;
    uVar71 = sVar70 * 0xc4 + sVar36;
    uVar74 = sVar73 * 0xb6 + sVar37;
    uVar77 = sVar76 * 0xa9 + sVar38;
    uVar80 = sVar79 * 0x9d + sVar39;
    uVar59 = uVar58 >> 8;
    uVar63 = uVar62 >> 8;
    uVar66 = uVar65 >> 8;
    uVar69 = uVar68 >> 8;
    uVar72 = uVar71 >> 8;
    uVar75 = uVar74 >> 8;
    uVar78 = uVar77 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = sVar57 * 0x91 + sVar40;
    uVar85 = sVar61 * 0x85 + sVar41;
    uVar87 = sVar64 * 0x7a + sVar42;
    uVar89 = sVar67 * 0x6f + sVar43;
    uVar91 = sVar70 * 0x65 + sVar44;
    uVar93 = sVar73 * 0x5c + sVar45;
    uVar95 = sVar76 * 0x53 + sVar46;
    uVar97 = sVar79 * 0x4a + sVar47;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    puVar22[-0x10] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar22[-0xf] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
    puVar22[-0xe] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    puVar22[-0xd] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    puVar22[-0xc] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar22[-0xb] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar22[-10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar22[-9] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar22[-8] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar22[-7] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar22[-6] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar22[-5] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar22[-4] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-3] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-2] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-1] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    uVar58 = sVar57 * 0x42 + sVar48;
    uVar62 = sVar61 * 0x3b + sVar49;
    uVar65 = sVar64 * 0x34 + sVar50;
    uVar68 = sVar67 * 0x2d + sVar51;
    uVar71 = sVar70 * 0x27 + sVar52;
    uVar74 = sVar73 * 0x22 + sVar53;
    uVar77 = sVar76 * 0x1d + sVar54;
    uVar80 = sVar79 * 0x19 + sVar55;
    uVar59 = uVar58 >> 8;
    uVar63 = uVar62 >> 8;
    uVar66 = uVar65 >> 8;
    uVar69 = uVar68 >> 8;
    uVar72 = uVar71 >> 8;
    uVar75 = uVar74 >> 8;
    uVar78 = uVar77 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = sVar57 * 0x15 + sVar24;
    uVar85 = sVar61 * 0x11 + sVar26;
    uVar87 = sVar64 * 0xe + sVar27;
    uVar89 = sVar67 * 0xc + sVar28;
    uVar91 = sVar70 * 10 + sVar29;
    uVar93 = sVar73 * 9 + sVar30;
    uVar95 = sVar76 * 8 + sVar31;
    uVar97 = sVar79 * 8 + sVar32;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    *puVar22 = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar22[1] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
    puVar22[2] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    puVar22[3] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    puVar22[4] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar22[5] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar22[6] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar22[7] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar22[8] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar22[9] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar22[10] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar22[0xb] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar22[0xc] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[0xd] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[0xe] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[0xf] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22 = puVar22 + stride;
  } while (uVar21 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_h_predictor_32x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  const __m128i left2 =
      cvtepu8_epi16(LoadLo8((const uint8_t *)left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
}